

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O2

PVIPNode *
PVIP_node_new_string(PVIPParserContext *parser,PVIP_node_type_t type,char *str,size_t len)

{
  PVIPNode *pPVar1;
  PVIPString *str_00;
  
  pPVar1 = pvip_node_alloc(parser->pvip);
  pPVar1->type = type;
  str_00 = PVIP_string_new();
  (pPVar1->field_2).pv = str_00;
  pPVar1->line_number = 0;
  PVIP_string_concat(str_00,str,len);
  return pPVar1;
}

Assistant:

PVIPNode * PVIP_node_new_string(PVIPParserContext* parser, PVIP_node_type_t type, const char* str, size_t len) {
    PVIPNode *node = pvip_node_alloc(parser->pvip);
    assert(
         type != PVIP_NODE_IDENT
      || type != PVIP_NODE_VARIABLE
      || type != PVIP_NODE_STRING
    );
    node->type = type;
    node->pv = PVIP_string_new();
    node->line_number = 0;
    PVIP_string_concat(node->pv, str, len);
    return node;
}